

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O1

int resolve_symbolnames(dl_phdr_info *info,size_t info_size,void *data)

{
  uint uVar1;
  uint8_t header;
  int iVar2;
  uint uVar3;
  lj_wbuf *buf;
  lua_State *L;
  Elf64_Addr EVar4;
  bool bVar5;
  unsigned_long_long uVar6;
  int iVar7;
  Elf64_Addr EVar8;
  ssize_t sVar9;
  FILE *__stream;
  size_t sVar10;
  ulong uVar11;
  uint *puVar12;
  Elf64_Sym *pEVar13;
  size_t sVar14;
  char *pcVar15;
  uint uVar16;
  ulong *puVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long *plVar22;
  uint uVar23;
  ulong uVar24;
  char executable_path [4096];
  void *local_10d0;
  ulong local_10b8;
  ulong local_10b0;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined8 uStack_1060;
  undefined8 local_1058;
  long lStack_1050;
  undefined8 local_1048;
  undefined8 uStack_1040;
  char local_1038 [4104];
  
  buf = *data;
  L = *(lua_State **)((long)data + 8);
  header = *(uint8_t *)((long)data + 0x10);
  memset(local_1038,0,0x1000);
  uVar6 = info->dlpi_adds;
  iVar7 = **(int **)((long)data + 0x20);
  EVar4 = info->dlpi_addr;
  EVar8 = getauxval(0x21);
  if (EVar4 == EVar8) {
    return 0;
  }
  iVar2 = (int)info->dlpi_adds;
  iVar21 = iVar2 - **(int **)((long)data + 0x20);
  *(int *)((long)data + 0x18) = iVar21;
  if (iVar21 == 0) {
    return 1;
  }
  uVar18 = *(uint *)((long)data + 0x14);
  uVar23 = (int)uVar6 - (iVar7 + iVar21);
  if (uVar18 < uVar23) goto LAB_0012a206;
  if (uVar18 == uVar23 - 1) {
    **(int **)((long)data + 0x20) = iVar2;
  }
  if (*info->dlpi_name == '\0') {
    sVar9 = readlink("/proc/self/exe",local_1038,0x1000);
    if (sVar9 != -1) {
      info->dlpi_name = local_1038;
    }
  }
  EVar4 = info->dlpi_addr;
  local_1048 = 0;
  uStack_1040 = 0;
  local_1058 = 0;
  lStack_1050 = 0;
  local_1068 = 0;
  uStack_1060 = 0;
  local_1078 = 0;
  uStack_1070 = 0;
  __stream = fopen64(info->dlpi_name,"rb");
  if (__stream != (FILE *)0x0) {
    sVar10 = fread(&local_1078,0x40,1,__stream);
    if (sVar10 != 0x40) {
      iVar7 = ferror(__stream);
      sVar10 = 0;
      bVar5 = false;
      if (iVar7 == 0) {
        local_10b8 = 0;
        local_10b0 = 0;
        uVar24 = 0;
        pEVar13 = (Elf64_Sym *)0x0;
        local_10d0 = (void *)0x0;
        pcVar15 = (char *)0x0;
        if ((int)local_1078 == 0x464c457f) goto LAB_0012a01a;
      }
      else {
        local_10b8 = 0;
        local_10b0 = 0;
        uVar24 = 0;
        pEVar13 = (Elf64_Sym *)0x0;
        local_10d0 = (void *)0x0;
        pcVar15 = (char *)0x0;
      }
      goto LAB_0012a079;
    }
    if ((int)local_1078 == 0x464c457f) {
LAB_0012a01a:
      lVar19 = lStack_1050;
      local_10b8 = (ulong)uStack_1040._4_2_;
      local_10b0 = (ulong)uStack_1040._2_2_;
      if (uStack_1040._2_2_ == 0 || (uStack_1040._4_2_ == 0 || lStack_1050 == 0)) goto LAB_0012a066;
      local_10d0 = lj_mem_realloc(L,(void *)0x0,0,(GCSize)(local_10b0 * local_10b8));
      if (local_10d0 != (void *)0x0) {
        iVar7 = fseek(__stream,lVar19,0);
        if (iVar7 != 0) {
          uVar24 = 0;
          pEVar13 = (Elf64_Sym *)0x0;
          pcVar15 = (char *)0x0;
          bVar5 = false;
          sVar10 = 0;
          goto LAB_0012a079;
        }
        sVar10 = fread(local_10d0,local_10b0,local_10b8,__stream);
        if ((sVar10 != local_10b0 * local_10b8) && (iVar7 = ferror(__stream), iVar7 != 0)) {
          sVar10 = 0;
          uVar24 = 0;
          goto LAB_0012a073;
        }
        puVar17 = (ulong *)((long)local_10d0 + 0x38);
        sVar10 = 0;
        uVar24 = local_10b8;
        do {
          if (*(int *)((long)puVar17 + -0x34) == 2) {
            uVar11 = puVar17[-4];
            lVar20 = (ulong)(uint)puVar17[-2] * 0x40;
            lVar19 = *(long *)((long)local_10d0 + lVar20 + 0x18);
            sVar10 = *(size_t *)((long)local_10d0 + lVar20 + 0x20);
            uVar24 = puVar17[-3] / *puVar17;
            goto LAB_0012a362;
          }
          puVar17 = puVar17 + 8;
          uVar24 = uVar24 - 1;
        } while (uVar24 != 0);
        uVar24 = 0;
        lVar19 = 0;
        uVar11 = 0;
LAB_0012a362:
        if (uVar24 == 0 || (lVar19 == 0 || uVar11 == 0)) goto LAB_0012a073;
        pcVar15 = (char *)0x0;
        pEVar13 = (Elf64_Sym *)lj_mem_realloc(L,(void *)0x0,0,(GCSize)(uVar24 * 0x18));
        if (pEVar13 == (Elf64_Sym *)0x0) {
          pEVar13 = (Elf64_Sym *)0x0;
          bVar5 = false;
          goto LAB_0012a079;
        }
        iVar7 = fseek(__stream,uVar11,0);
        if ((iVar7 != 0) ||
           ((sVar14 = fread(pEVar13,0x18,uVar24,__stream), sVar14 != uVar24 * 0x18 &&
            (iVar7 = ferror(__stream), iVar7 != 0)))) {
          pcVar15 = (char *)0x0;
LAB_0012a3d5:
          bVar5 = false;
          goto LAB_0012a079;
        }
        pcVar15 = (char *)lj_mem_realloc(L,(void *)0x0,0,(GCSize)sVar10);
        if (pcVar15 == (char *)0x0) {
          pcVar15 = (char *)0x0;
        }
        else {
          iVar7 = fseek(__stream,lVar19,0);
          if (iVar7 == 0) {
            sVar14 = fread(pcVar15,1,sVar10,__stream);
            if ((sVar14 == sVar10) || (iVar7 = ferror(__stream), iVar7 == 0)) {
              write_c_symtab(pEVar13,pcVar15,EVar4,uVar24,header,buf);
              bVar5 = true;
              goto LAB_0012a079;
            }
            goto LAB_0012a3d5;
          }
        }
        goto LAB_0012a076;
      }
      sVar10 = 0;
      uVar24 = 0;
      local_10d0 = (void *)0x0;
      pcVar15 = (char *)0x0;
      bVar5 = false;
      pEVar13 = (Elf64_Sym *)0x0;
    }
    else {
      local_10b8 = 0;
      local_10b0 = 0;
LAB_0012a066:
      sVar10 = 0;
      uVar24 = 0;
      local_10d0 = (void *)0x0;
LAB_0012a073:
      pEVar13 = (Elf64_Sym *)0x0;
      pcVar15 = (char *)0x0;
LAB_0012a076:
      bVar5 = false;
    }
LAB_0012a079:
    if (pEVar13 != (Elf64_Sym *)0x0) {
      uVar11 = (ulong)(L->glref).ptr32;
      lVar19 = uVar24 * 0x18;
      *(int *)(uVar11 + 0x50) = *(int *)(uVar11 + 0x50) - (int)lVar19;
      *(long *)(uVar11 + 0x90) = *(long *)(uVar11 + 0x90) + lVar19;
      (**(code **)(uVar11 + 0x40))(*(undefined8 *)(uVar11 + 0x48),pEVar13,lVar19,0);
    }
    if (pcVar15 != (char *)0x0) {
      uVar24 = (ulong)(L->glref).ptr32;
      *(int *)(uVar24 + 0x50) = *(int *)(uVar24 + 0x50) - (int)sVar10;
      *(long *)(uVar24 + 0x90) = *(long *)(uVar24 + 0x90) + sVar10;
      (**(code **)(uVar24 + 0x40))(*(undefined8 *)(uVar24 + 0x48),pcVar15,sVar10,0);
    }
    if (local_10d0 != (void *)0x0) {
      uVar24 = (ulong)(L->glref).ptr32;
      lVar19 = local_10b0 * local_10b8;
      *(int *)(uVar24 + 0x50) = *(int *)(uVar24 + 0x50) - (int)lVar19;
      *(long *)(uVar24 + 0x90) = *(long *)(uVar24 + 0x90) + lVar19;
      (**(code **)(uVar24 + 0x40))(*(undefined8 *)(uVar24 + 0x48),local_10d0,lVar19,0);
    }
    fclose(__stream);
    if (bVar5) goto LAB_0012a203;
  }
  if ((ulong)info->dlpi_phnum != 0) {
    lVar19 = 0;
    do {
      if (*(int *)((long)&info->dlpi_phdr->p_type + lVar19) == 2) {
        plVar22 = (long *)(*(long *)((long)&info->dlpi_phdr->p_vaddr + lVar19) + info->dlpi_addr + 8
                          );
        pEVar13 = (Elf64_Sym *)0x0;
        lVar19 = 0;
        puVar12 = (uint *)0x0;
        pcVar15 = (char *)0x0;
        goto LAB_0012a156;
      }
      lVar19 = lVar19 + 0x38;
    } while ((ulong)info->dlpi_phnum * 0x38 - lVar19 != 0);
  }
LAB_0012a1da:
  lj_wbuf_addbyte(buf,'\x01');
  lj_wbuf_addu64(buf,info->dlpi_addr);
  lj_wbuf_addstring(buf,info->dlpi_name);
LAB_0012a203:
  uVar18 = *(uint *)((long)data + 0x14);
LAB_0012a206:
  *(uint *)((long)data + 0x14) = uVar18 + 1;
  return 0;
LAB_0012a156:
  switch(plVar22[-1]) {
  case 0:
    goto switchD_0012a167_caseD_0;
  case 1:
  case 2:
  case 3:
    break;
  case 4:
    lVar19 = *plVar22;
    break;
  case 5:
    pcVar15 = (char *)*plVar22;
    break;
  case 6:
    pEVar13 = (Elf64_Sym *)*plVar22;
    break;
  default:
    if (plVar22[-1] == 0x6ffffef5) {
      puVar12 = (uint *)*plVar22;
    }
  }
  plVar22 = plVar22 + 2;
  goto LAB_0012a156;
switchD_0012a167_caseD_0:
  if (((lVar19 == 0 && puVar12 == (uint *)0x0) || (pcVar15 == (char *)0x0)) ||
     (pEVar13 == (Elf64_Sym *)0x0)) goto LAB_0012a1da;
  if (puVar12 == (uint *)0x0) {
    uVar18 = *(uint *)(lVar19 + 4);
  }
  else {
    uVar23 = *puVar12;
    if ((ulong)uVar23 == 0) {
      uVar16 = 0;
    }
    else {
      lVar19 = 0;
      uVar16 = 0;
      do {
        if (uVar16 <= puVar12[(ulong)puVar12[2] * 2 + lVar19 + 4]) {
          uVar16 = puVar12[(ulong)puVar12[2] * 2 + lVar19 + 4];
        }
        lVar19 = lVar19 + 1;
      } while (uVar23 != (uint)lVar19);
    }
    uVar3 = puVar12[1];
    uVar18 = uVar3;
    if (uVar3 <= uVar16) {
      do {
        uVar1 = uVar16 - uVar3;
        uVar16 = uVar16 + 1;
        uVar18 = uVar16;
      } while ((puVar12[(ulong)puVar12[2] * 2 + (ulong)uVar23 + (ulong)uVar1 + 4] & 1) == 0);
    }
  }
  write_c_symtab(pEVar13,pcVar15,info->dlpi_addr,(ulong)uVar18,header,buf);
  goto LAB_0012a203;
}

Assistant:

static int resolve_symbolnames(struct dl_phdr_info *info, size_t info_size,
			       void *data)
{
  struct symbol_resolver_conf *conf = data;
  struct lj_wbuf *buf = conf->buf;
  lua_State *L = conf->L;
  const uint8_t header = conf->header;
  char executable_path[PATH_MAX] = {0};

  uint32_t lib_cnt = 0;

  /*
  ** Check that dlpi_adds and dlpi_subs fields are available.
  ** Assertion was taken from the GLIBC tests:
  ** https://code.woboq.org/userspace/glibc/elf/tst-dlmodcount.c.html#37
  */
  lj_assertL(info_size > offsetof(struct dl_phdr_info, dlpi_subs)
			 + sizeof(info->dlpi_subs),
	     "bad dlpi_subs");

  lib_cnt = info->dlpi_adds - *conf->lib_adds;

  /* Skip vDSO library. */
  if (info->dlpi_addr == getauxval(AT_SYSINFO_EHDR))
    return 0;

  if ((conf->to_dump_cnt = info->dlpi_adds - *conf->lib_adds) == 0)
    /* No new libraries, stop resolver. */
    return 1;

  if (conf->cur_lib < lib_cnt - conf->to_dump_cnt) {
    /* That lib is already dumped, skip it. */
    ++conf->cur_lib;
    return 0;
  }

  if (conf->cur_lib == lib_cnt - conf->to_dump_cnt - 1)
    /* Last library, update memrpof's lib counter. */
    *conf->lib_adds = info->dlpi_adds;

  /*
  ** The `dl_iterate_phdr` returns an empty string as a name for
  ** the executable from which it was called. It is still possible
  ** to access its dynamic symbol table, but it is vital for
  ** sysprof to obtain the main symbol table for the LuaJIT
  ** executable. To do so, we need a valid path to the executable.
  ** Since there is no way to obtain the path to a running
  ** executable using the C standard library, the only more or
  ** less reliable way to do this is by reading the symbolic link
  ** from `/proc/self/exe`. Most of the UNIX-based systems have
  ** procfs, so it is not a problem.
  ** Such path tweaks relate only for the main way (see below).
  */
  if (*info->dlpi_name == '\0') {
    if (readlink("/proc/self/exe", executable_path, PATH_MAX) != -1)
      info->dlpi_name = executable_path;
    else
      /*
      ** It is impossible for sysprof to work properly without the
      ** LuaJIT's .symtab section present. The assertion below is
      ** unlikely to be triggered on any system supported by
      ** sysprof, unless someone have deleted the LuaJIT binary
      ** right after the start.
      */
      lj_assertL(0, "bad executed binary symtab section");
  }

  /*
  ** Main way: try to open ELF and read SHT_SYMTAB, SHT_STRTAB and SHT_HASH
  ** sections from it.
  */
  if (dump_sht_symtab(info->dlpi_name, buf, L, header, info->dlpi_addr) == 0) {
    ++conf->cur_lib;
  }
  /* First fallback: dump functions only from PT_DYNAMIC segment. */
  else if(dump_dyn_symtab(info, header, buf) == 0) {
    ++conf->cur_lib;
  }
  /*
  ** Last resort: dump ELF size and address to show .so name for its functions
  ** in memprof output.
  */
  else {
    lj_wbuf_addbyte(buf, SYMTAB_CFUNC);
    lj_wbuf_addu64(buf, info->dlpi_addr);
    lj_wbuf_addstring(buf, info->dlpi_name);
    ++conf->cur_lib;
  }

  return 0;
}